

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O2

void lj_func_closeuv(lua_State *L,TValue *level)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  GCobj *v;
  GCobj *o;
  global_State *g;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  while( true ) {
    uVar2 = (L->openupval).gcptr32;
    o = (GCobj *)(ulong)uVar2;
    if ((o == (GCobj *)0x0) || ((TValue *)(ulong)(o->gch).metatable.gcptr32 < level)) break;
    (L->openupval).gcptr32 = (o->gch).nextgc.gcptr32;
    if ((~(g->gc).currentwhite & (o->gch).marked & 3) == 0) {
      uVar3 = (o->str).hash;
      *(uint *)((ulong)(o->str).len + 8) = uVar3;
      *(uint32_t *)((ulong)uVar3 + 0xc) = (o->gch).gclist.gcptr32;
      uVar4 = *(undefined8 *)(ulong)(o->gch).metatable.gcptr32;
      *(int *)((long)o + 8) = (int)uVar4;
      *(int *)((long)o + 0xc) = (int)((ulong)uVar4 >> 0x20);
      (o->gch).metatable.gcptr32 = (uint32_t)&(o->str).hash;
      (o->gch).unused1 = '\x01';
      (o->gch).nextgc.gcptr32 = (g->gc).root.gcptr32;
      (g->gc).root.gcptr32 = uVar2;
      bVar1 = (o->gch).marked;
      if ((bVar1 & 7) == 0) {
        if ((byte)((g->gc).state - 1) < 2) {
          (o->gch).marked = bVar1 | 4;
          if (((o->str).len + 0xd < 9) &&
             (v = (GCobj *)(ulong)(o->str).hash, ((v->gch).marked & 3) != 0)) {
            lj_gc_barrierf(g,o,v);
          }
        }
        else {
          (o->gch).marked = (g->gc).currentwhite & 3 | bVar1;
        }
      }
    }
    else {
      lj_func_freeuv(g,&o->uv);
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_func_closeuv(lua_State *L, TValue *level)
{
  GCupval *uv;
  global_State *g = G(L);
  while (gcref(L->openupval) != NULL &&
	 uvval((uv = gco2uv(gcref(L->openupval)))) >= level) {
    GCobj *o = obj2gco(uv);
    lua_assert(!isblack(o) && !uv->closed && uvval(uv) != &uv->tv);
    setgcrefr(L->openupval, uv->nextgc);  /* No longer in open list. */
    if (isdead(g, o)) {
      lj_func_freeuv(g, uv);
    } else {
      unlinkuv(uv);
      lj_gc_closeuv(g, uv);
    }
  }
}